

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullseq.c
# Opt level: O2

int main(int argc,char **argv)

{
  UT_hash_bucket *pUVar1;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar2;
  UT_hash_handle *pUVar3;
  bool bVar4;
  bool bVar5;
  char *__s1;
  char *aStrRegex;
  int iVar6;
  uint uVar7;
  int *piVar8;
  FILE *__stream;
  lookup_t *plVar9;
  char *pcVar10;
  UT_hash_table *pUVar11;
  UT_hash_table *pUVar12;
  UT_hash_bucket *pUVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  UT_hash_handle *pUVar21;
  uint uVar22;
  UT_hash_handle *pUVar23;
  lookup_t *plVar24;
  byte *pbVar25;
  size_t sStackY_b8;
  size_t sVar26;
  int local_78;
  uint local_74;
  uint local_70;
  char *end;
  undefined8 local_60;
  undefined8 local_58;
  uint local_50;
  int option_index;
  char *local_48;
  char *local_40;
  char *local_38;
  
  verbose_flag = 0;
  progname = *argv;
  if (3 < argc) {
    local_74 = 0x32;
    local_40 = (char *)0x0;
    local_48 = (char *)0x0;
    local_70 = 0xffffffff;
    bVar5 = false;
    local_78 = 0;
    local_60 = 0;
    local_58 = 0;
    local_38 = (char *)0x0;
    local_50 = local_70;
LAB_001026a3:
    option_index = 0;
    iVar6 = getopt_long(argc,argv,"Vvh?cetq:i:g:Nn:m:a:l:",main::long_options,&option_index);
    aStrRegex = local_38;
    __s1 = local_40;
    pcVar10 = local_48;
    uVar7 = local_50;
    pcVar19 = _optarg;
    switch(iVar6) {
    case 0x61:
      strtol(_optarg,&end,0);
      if ((*end != '\0') || (piVar8 = __errno_location(), *piVar8 != 0)) {
        pcVar19 = "Maximum value (-a) argument \'%s\' is not an integer\n";
        goto LAB_00102ae7;
      }
      local_70 = atoi(_optarg);
      goto LAB_001026a3;
    case 0x62:
    case 100:
    case 0x66:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x73:
    case 0x75:
switchD_001026cf_caseD_62:
      abort();
    case 99:
      QUALITY_SCORE = 0x3d;
      local_58 = 1;
      goto LAB_001026a3;
    case 0x65:
      local_78 = 1;
      goto LAB_001026a3;
    case 0x67:
      sVar26 = strlen(_optarg);
      pcVar10 = (char *)malloc(sVar26 + 1);
      local_38 = pcVar10;
      break;
    case 0x68:
      goto switchD_001026cf_caseD_68;
    case 0x69:
      sVar26 = strlen(_optarg);
      pcVar10 = (char *)malloc(sVar26 + 1);
      local_40 = pcVar10;
      break;
    case 0x6c:
      strtol(_optarg,&end,0);
      if ((*end != '\0') || (piVar8 = __errno_location(), *piVar8 != 0)) {
        pcVar19 = "Sequence length value (-l) argument \'%s\' is not an integer\n";
        goto LAB_00102ae7;
      }
      local_74 = atoi(_optarg);
      goto LAB_001026a3;
    case 0x6d:
      strtol(_optarg,&end,0);
      if ((*end != '\0') || (piVar8 = __errno_location(), *piVar8 != 0)) {
        pcVar19 = "Maximum value (-m) argument \'%s\' is not an integer\n";
LAB_00102ae7:
        fprintf(_stderr,pcVar19,_optarg);
        return 1;
      }
      local_50 = atoi(_optarg);
      goto LAB_001026a3;
    case 0x6e:
      sVar26 = strlen(_optarg);
      pcVar10 = (char *)malloc(sVar26 + 1);
      local_48 = pcVar10;
      break;
    case 0x71:
      strtol(_optarg,&end,0);
      if ((*end != '\0') || (piVar8 = __errno_location(), *piVar8 != 0)) {
        pcVar19 = 
        "Quality ASCII value (-q) is invalid - must be an ASCII code (e.g. 73, which is \'I\')\n";
        sVar26 = 0x54;
        goto LAB_00102bfd;
      }
      QUALITY_SCORE = atoi(_optarg);
      goto LAB_001026a3;
    case 0x74:
      local_60 = 1;
      goto LAB_001026a3;
    case 0x76:
      verbose_flag = 1;
      goto LAB_001026a3;
    default:
      goto switchD_001026cf_default;
    }
    strcpy(pcVar10,pcVar19);
    goto LAB_001026a3;
  }
switchD_001026cf_caseD_68:
  pcVar19 = (char *)0x1;
  show_usage(1);
  plVar9 = (lookup_t *)malloc(0x40);
  if (plVar9 == (lookup_t *)0x0) {
    pcVar19 = "couldn\'t get memory for lookup_t\n";
    sStackY_b8 = 0x21;
  }
  else {
    sVar26 = strlen(pcVar19);
    pcVar10 = (char *)malloc(sVar26 * 8 + 8);
    plVar9->name = pcVar10;
    if (pcVar10 != (char *)0x0) {
      strncpy(pcVar10,pcVar19,sVar26 + 1);
      pUVar23 = &plVar9->hh;
      (plVar9->hh).next = (void *)0x0;
      (plVar9->hh).key = pcVar10;
      sVar26 = strlen(pcVar10);
      (plVar9->hh).keylen = (uint)sVar26;
      plVar24 = lookup;
      if (lookup == (lookup_t *)0x0) {
        lookup = plVar9;
        (plVar9->hh).prev = (void *)0x0;
        pUVar11 = (UT_hash_table *)calloc(1,0x40);
        (plVar9->hh).tbl = pUVar11;
        if (pUVar11 != (UT_hash_table *)0x0) {
          pUVar11->tail = pUVar23;
          pUVar11->num_buckets = 0x20;
          pUVar11->log2_num_buckets = 5;
          pUVar11->hho = 8;
          pUVar13 = (UT_hash_bucket *)calloc(1,0x200);
          pUVar11->buckets = pUVar13;
          if (pUVar13 != (UT_hash_bucket *)0x0) {
            pUVar11->signature = 0xa0111fe1;
            plVar24 = plVar9;
            goto LAB_00102e0c;
          }
        }
      }
      else {
        pUVar11 = (lookup->hh).tbl;
        pUVar21 = pUVar11->tail;
        pUVar21->next = plVar9;
        (plVar9->hh).prev = (void *)((long)pUVar21 - pUVar11->hho);
        pUVar11->tail = pUVar23;
LAB_00102e0c:
        uVar16 = pUVar11->num_items + 1;
        pUVar11->num_items = uVar16;
        (plVar9->hh).tbl = pUVar11;
        sVar26 = strlen(pcVar10);
        pbVar25 = (byte *)(pcVar10 + 10);
        uVar14 = 0x9e3779b9;
        uVar7 = 0xfeedbeef;
        uVar17 = 0x9e3779b9;
        uVar18 = sVar26 & 0xffffffff;
        while (uVar15 = (uint)uVar18, 0xb < uVar15) {
          uVar7 = uVar7 + *(int *)(pbVar25 + -2);
          uVar20 = uVar7 >> 0xd ^
                   ((uVar17 + *(int *)(pbVar25 + -10)) - (uVar14 + *(int *)(pbVar25 + -6))) - uVar7;
          uVar17 = uVar20 << 8 ^ ((uVar14 + *(int *)(pbVar25 + -6)) - uVar7) - uVar20;
          uVar14 = uVar17 >> 0xd ^ (uVar7 - uVar20) - uVar17;
          uVar7 = uVar14 >> 0xc ^ (uVar20 - uVar17) - uVar14;
          uVar20 = uVar7 << 0x10 ^ (uVar17 - uVar14) - uVar7;
          uVar22 = uVar20 >> 5 ^ (uVar14 - uVar7) - uVar20;
          uVar17 = uVar22 >> 3 ^ (uVar7 - uVar20) - uVar22;
          uVar14 = uVar17 << 10 ^ (uVar20 - uVar22) - uVar17;
          uVar7 = uVar14 >> 0xf ^ (uVar22 - uVar17) - uVar14;
          (plVar9->hh).hashv = uVar7;
          pbVar25 = pbVar25 + 0xc;
          uVar18 = (ulong)(uVar15 - 0xc);
        }
        uVar7 = uVar7 + (int)sVar26;
        switch(uVar15) {
        case 0xb:
          uVar7 = (uint)*pbVar25 * 0x1000000 + uVar7;
          (plVar9->hh).hashv = uVar7;
        case 10:
          uVar7 = (uint)pbVar25[-1] * 0x10000 + uVar7;
        case 9:
          uVar7 = (uint)pbVar25[-2] * 0x100 + uVar7;
          (plVar9->hh).hashv = uVar7;
        case 8:
          uVar14 = (uint)pbVar25[-3] * 0x1000000 + uVar14;
        case 7:
          uVar14 = (uint)pbVar25[-4] * 0x10000 + uVar14;
        case 6:
          uVar14 = (uint)pbVar25[-5] * 0x100 + uVar14;
        case 5:
          uVar14 = pbVar25[-6] + uVar14;
        case 4:
          uVar17 = (uint)pbVar25[-7] * 0x1000000 + uVar17;
        case 3:
          uVar17 = (uint)pbVar25[-8] * 0x10000 + uVar17;
        case 2:
          uVar17 = (uint)pbVar25[-9] * 0x100 + uVar17;
        case 1:
          uVar17 = pbVar25[-10] + uVar17;
        }
        uVar17 = uVar7 >> 0xd ^ (uVar17 - uVar14) - uVar7;
        uVar20 = uVar17 << 8 ^ (uVar14 - uVar7) - uVar17;
        uVar15 = uVar20 >> 0xd ^ (uVar7 - uVar17) - uVar20;
        uVar14 = uVar15 >> 0xc ^ (uVar17 - uVar20) - uVar15;
        uVar7 = uVar14 << 0x10 ^ (uVar20 - uVar15) - uVar14;
        uVar17 = uVar7 >> 5 ^ (uVar15 - uVar14) - uVar7;
        uVar14 = uVar17 >> 3 ^ (uVar14 - uVar7) - uVar17;
        uVar7 = uVar14 << 10 ^ (uVar7 - uVar17) - uVar14;
        uVar7 = uVar7 >> 0xf ^ uVar17 - (uVar14 + uVar7);
        (plVar9->hh).hashv = uVar7;
        pUVar12 = (plVar24->hh).tbl;
        pUVar13 = pUVar12->buckets;
        pUVar12 = (UT_hash_table *)((ulong)(pUVar12->num_buckets - 1 & uVar7) * 0x10);
        piVar8 = (int *)((long)&pUVar12->num_buckets + (long)pUVar13);
        *piVar8 = *piVar8 + 1;
        pUVar21 = *(UT_hash_handle **)((long)&pUVar12->buckets + (long)pUVar13);
        (plVar9->hh).hh_next = pUVar21;
        (plVar9->hh).hh_prev = (UT_hash_handle *)0x0;
        if (pUVar21 != (UT_hash_handle *)0x0) {
          pUVar21->hh_prev = pUVar23;
        }
        *(UT_hash_handle **)((long)&pUVar12->buckets + (long)pUVar13) = pUVar23;
        pUVar13 = ((lookup->hh).tbl)->buckets;
        if ((*(uint *)((long)&pUVar12->num_buckets + (long)pUVar13) <
             *(int *)((long)&pUVar12->log2_num_buckets + (long)pUVar13) * 10 + 10U) ||
           (pUVar11->noexpand == 1)) {
LAB_0010311d:
          return (int)pUVar12;
        }
        uVar7 = pUVar11->num_buckets;
        uVar14 = uVar7 * 2;
        pUVar13 = (UT_hash_bucket *)calloc(1,(ulong)uVar14 << 4);
        if (pUVar13 != (UT_hash_bucket *)0x0) {
          uVar14 = uVar14 - 1;
          uVar16 = ((uVar16 >> ((char)pUVar11->log2_num_buckets + 1U & 0x1f)) + 1) -
                   (uint)((uVar14 & uVar16) == 0);
          pUVar11->ideal_chain_maxlen = uVar16;
          pUVar11->nonideal_items = 0;
          __ptr = pUVar11->buckets;
          uVar17 = 0;
          for (uVar18 = 0; uVar18 != uVar7; uVar18 = uVar18 + 1) {
            pUVar21 = __ptr[uVar18].hh_head;
            while (pUVar21 != (UT_hash_handle *)0x0) {
              pUVar2 = pUVar21->hh_next;
              uVar20 = pUVar21->hashv & uVar14;
              pUVar1 = pUVar13 + uVar20;
              uVar15 = pUVar13[uVar20].count + 1;
              pUVar13[uVar20].count = uVar15;
              if (uVar16 < uVar15) {
                uVar17 = uVar17 + 1;
                pUVar11->nonideal_items = uVar17;
                pUVar1->expand_mult = uVar15 / uVar16;
              }
              pUVar21->hh_prev = (UT_hash_handle *)0x0;
              pUVar3 = pUVar1->hh_head;
              pUVar21->hh_next = pUVar3;
              if (pUVar3 != (UT_hash_handle *)0x0) {
                pUVar3->hh_prev = pUVar21;
              }
              pUVar1->hh_head = pUVar21;
              pUVar21 = pUVar2;
            }
          }
          free(__ptr);
          pUVar12 = pUVar23->tbl;
          pUVar12->num_buckets = pUVar12->num_buckets << 1;
          pUVar12->log2_num_buckets = pUVar12->log2_num_buckets + 1;
          pUVar12->buckets = pUVar13;
          if (pUVar12->num_items >> 1 < pUVar12->nonideal_items) {
            uVar7 = pUVar12->ineff_expands + 1;
            pUVar12->ineff_expands = uVar7;
            if (1 < uVar7) {
              pUVar12->noexpand = 1;
            }
          }
          else {
            pUVar12->ineff_expands = 0;
          }
          goto LAB_0010311d;
        }
      }
      iVar6 = -1;
      goto LAB_00103163;
    }
    pcVar19 = "couldn\'t get memory for name string\n";
    sStackY_b8 = 0x24;
  }
  fwrite(pcVar19,sStackY_b8,1,_stderr);
  iVar6 = 1;
LAB_00103163:
  exit(iVar6);
switchD_001026cf_default:
  if (iVar6 == 0x3f) goto LAB_001026a3;
  if (iVar6 == 0x4e) {
    bVar5 = true;
    goto LAB_001026a3;
  }
  if (iVar6 == 0x56) {
    printf("Version is %s\n","1.0.2");
    goto LAB_001026a3;
  }
  if (iVar6 != -1) goto switchD_001026cf_caseD_62;
  if (verbose_flag != 0) {
    fwrite("verbose flag is set\n",0x14,1,_stderr);
    fprintf(_stderr,"Input is %s\n",__s1);
    if ((int)local_58 != 0) {
      fwrite("Input will be converted between FASTQ and FASTA\n",0x30,1,_stderr);
    }
    if (bVar5) {
      if (local_78 == 0) {
        pcVar19 = "Names in STDIN will be included\n";
      }
      else {
        pcVar19 = "Names in STDIN will be excluded\n";
      }
      fwrite(pcVar19,0x20,1,_stderr);
    }
    else if (pcVar10 != (char *)0x0) {
      if (local_78 == 0) {
        pcVar19 = "Names in %s will be included\n";
      }
      else {
        pcVar19 = "Names in %s will be excluded\n";
      }
      fprintf(_stderr,pcVar19,pcVar10);
    }
    if (aStrRegex != (char *)0x0) {
      pcVar19 = "Only sequences not matching %s will be output\n";
      if (local_78 == 0) {
        pcVar19 = "Only sequences matching %s will be output\n";
      }
      fprintf(_stderr,pcVar19,aStrRegex);
    }
    if (0 < (int)local_70) {
      fprintf(_stderr,"Only sequences less than %i will be output\n",(ulong)local_70);
    }
    if (0 < (int)uVar7) {
      fprintf(_stderr,"Only sequences greater than %i will be output\n",(ulong)uVar7);
    }
    if (0 < (int)local_74) {
      fprintf(_stderr,"Output will be %i columns long\n",(ulong)local_74);
    }
    if (0 < (int)local_60) {
      fwrite("Output will be counted only\n",0x1c,1,_stderr);
    }
  }
  if (__s1 == (char *)0x0) {
    pcVar19 = "Error: Input file is required.\n";
    sVar26 = 0x1f;
    goto LAB_00102bfd;
  }
  bVar4 = bVar5;
  if (pcVar10 == (char *)0x0) {
LAB_0010293d:
    if ((bool)(aStrRegex != (char *)0x0 & bVar4)) {
      pcVar19 = "Error: You can\'t use a names file or names from STDIN and a regex match.\n";
      sVar26 = 0x49;
      goto LAB_00102bfd;
    }
    if ((int)uVar7 < (int)local_70 || ((int)local_70 < 1 || (int)uVar7 < 1)) {
      if (bVar4) {
        __stream = _stdin;
        if ((pcVar10 != (char *)0x0) && (__stream = fopen(pcVar10,"r"), __stream == (FILE *)0x0)) {
          fprintf(_stderr,"%s - failed to open names file %s\n",progname,pcVar10);
          exit(1);
        }
        uVar7 = pull_by_name(__s1,(FILE *)__stream,uVar7,local_70,local_74,local_78,(int)local_58,
                             (int)local_60);
      }
      else {
        if (aStrRegex == (char *)0x0) {
          uVar7 = pull_by_size(__s1,uVar7,local_70,local_74,(int)local_58,(int)local_60);
        }
        else {
          uVar7 = pull_by_re(__s1,aStrRegex,uVar7,local_70,local_74,local_78,(int)local_58,
                             (int)local_60);
        }
        pcVar10 = (char *)0x0;
        __stream = (FILE *)0x0;
      }
      free(__s1);
      free(pcVar10);
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      free(aStrRegex);
      if (verbose_flag != 0) {
        fprintf(_stderr,"Pulled %i entries\n",(ulong)uVar7);
      }
      fclose(_stderr);
      fclose(_stdout);
      fclose(_stdin);
      return 0;
    }
    pcVar19 = "Error: Max is less than or equal to min.\n";
  }
  else {
    iVar6 = strcmp(__s1,pcVar10);
    if (iVar6 != 0) {
      bVar4 = true;
      if (bVar5) {
        pcVar19 = "Error: Cannot use names from STDIN *and* names from a file.\n";
        sVar26 = 0x3c;
        goto LAB_00102bfd;
      }
      goto LAB_0010293d;
    }
    pcVar19 = "Error: Input file is same as names file.\n";
  }
  sVar26 = 0x29;
LAB_00102bfd:
  fwrite(pcVar19,sVar26,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
	int c;
	char *in = NULL,*names = NULL;
	FILE *names_fp = NULL;
	int min = -1, max = -1;
	int names_from_stdin = 0;
	int exclude = 0;
	int count = 0;
	int just_count = 0; /* flag for just counting the output */
	int convert = 0;
	int length = 50;
	long value;
	char *end;
	char *aStrRegex = NULL;

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */

	progname = argv[0];
	if (argc < 4) { /* progname + at least 3 other args */
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",     no_argument,       0, 'v'},
			{"convert",     no_argument,       0, 'c'},
			{"exclude",     no_argument,       0, 'e'},
			{"count",       no_argument,       0, 't'},
			{"version",     no_argument,       0, 'V'},
			{"help",        no_argument,       0, 'h'},
			{"input",       required_argument, 0, 'i'},
			{"regex",       required_argument, 0, 'g'},
			{"names",       required_argument, 0, 'n'},
			{"names_stdin", no_argument,       0, 'N'},
			{"min",         required_argument, 0, 'm'},
			{"max",         required_argument, 0, 'a'},
			{"length",      required_argument, 0, 'l'},
			{"quality",     required_argument, 0, 'q'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long (argc, argv, "Vvh?cetq:i:g:Nn:m:a:l:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'i':
				in = (char*) malloc(strlen(optarg)+1);
				strcpy(in,optarg);
				break;

			case 'g':
				aStrRegex = (char*) malloc(strlen(optarg)+1);
				strcpy(aStrRegex, optarg);
				break;

			case 'n':
				names = (char*) malloc(strlen(optarg)+1);
				strcpy(names, optarg);
				break;

			case 'N':
				names_from_stdin = 1;
				break;

			case 'm':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					min = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-m) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'a':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					max = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-a) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'c':
				convert = 1;
				QUALITY_SCORE = 61;
				break;

			case 't':
				just_count = 1;
				break;

			case 'q':
				value = strtol(optarg, &end, 0);
				if (*end == 0 && errno == 0) {
					QUALITY_SCORE = atoi(optarg);
				} else {
					fprintf(stderr, "Quality ASCII value (-q) is invalid - must be an ASCII code (e.g. 73, which is 'I')\n");
					return EXIT_FAILURE;
				}
				break;

			case 'e':
				exclude = 1;
				break;

			case 'l':
				value = strtol(optarg, &end,0);
				if (*end == '\0' && errno == 0) {
					length = atoi(optarg);
				} else {
					fprintf(stderr, "Sequence length value (-l) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'V':
				/* version */
				printf("Version is %s\n", PULLSEQ_VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"Input is %s\n", in);
		if (convert)
			fprintf(stderr,"Input will be converted between FASTQ and FASTA\n");
		if (names_from_stdin) {
			if (exclude)
				fprintf(stderr,"Names in STDIN will be excluded\n");
			else
				fprintf(stderr,"Names in STDIN will be included\n");

		} else if (names != NULL) {
			if (exclude) {
				fprintf(stderr,"Names in %s will be excluded\n", names);
            }
			else {
				fprintf(stderr,"Names in %s will be included\n", names);
            }
		}
		if (aStrRegex)
			if (exclude) {
				fprintf(stderr,"Only sequences not matching %s will be output\n", aStrRegex);
            }
			else {
				fprintf(stderr,"Only sequences matching %s will be output\n", aStrRegex);
            }
		if (max > 0)
			fprintf(stderr,"Only sequences less than %i will be output\n", max);
		if (min > 0)
			fprintf(stderr,"Only sequences greater than %i will be output\n", min);
		if (length > 0)
			fprintf(stderr,"Output will be %i columns long\n", length);
		if (just_count > 0)
			fprintf(stderr,"Output will be counted only\n");
	}

	/* check validity of given argument set */
	if (!in) {
		fprintf (stderr, "Error: Input file is required.\n");
		return EXIT_FAILURE;
	}

	if (names) {
		if (!strcmp(in, names)) {
			fprintf (stderr, "Error: Input file is same as names file.\n");
			return EXIT_FAILURE;
		}
	}

	if (names && names_from_stdin) {
		fprintf (stderr, "Error: Cannot use names from STDIN *and* names from a file.\n");
		return EXIT_FAILURE;
	}

	if (aStrRegex) {
		if (names || names_from_stdin) {
			fprintf (stderr, "Error: You can't use a names file or names from STDIN and a regex match.\n");
			return EXIT_FAILURE;
		}
	}

	if (min > 0 && max > 0) {
		if (max <= min) {
			fprintf (stderr, "Error: Max is less than or equal to min.\n");
			return EXIT_FAILURE;
		}
	}

	if (names || names_from_stdin) {
		if (names) {
			names_fp = fopen(names,"r");
			if (!names_fp) {
				fprintf(stderr,"%s - failed to open names file %s\n",progname, names);
				exit(EXIT_FAILURE);
			}
		} else {
			names_fp = stdin;
		}
		count = pull_by_name(in, names_fp, min, max, length, exclude, convert, just_count);
	} else if (aStrRegex) {
		count = pull_by_re(in, aStrRegex, min, max, length, exclude, convert, just_count);
	} else {
		count = pull_by_size(in, min, max, length, convert, just_count);
	}

	/* free up memory */
	free(in);

	if (names)
		free(names);

	if (names_fp)
		fclose(names_fp);

	if (aStrRegex)
		free(aStrRegex);

	if (verbose_flag)
		fprintf(stderr,"Pulled %i entries\n",count);

	/* close streams */
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}